

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTarget::AddTracedSources
          (cmTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *srcs)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  cmListFileBacktrace lfbt;
  undefined1 auStack_48 [16];
  string local_38;
  
  if ((srcs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (srcs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    cmMakefile::GetBacktrace((cmMakefile *)auStack_48);
    _Var1._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_38,srcs,";");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &(_Var1._M_head_impl)->SourceEntries,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
              (&((this->impl)._M_t.
                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->SourceBacktraces,
               (value_type *)auStack_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_48 + 8));
  }
  return;
}

Assistant:

cmBacktraceRange cmTarget::GetLinkDirectoriesBacktraces() const
{
  return cmMakeRange(impl->LinkDirectoriesBacktraces);
}